

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::NegativeTestShared::(anonymous_namespace)::
genShaderSourceTextureGrad_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,NegativeTestContext *ctx,
          ShaderType shaderType,DataType samplerDataType,DataType pDataType,DataType dpdxDataType,
          DataType dpdyDataType)

{
  bool bVar1;
  RenderContext *pRVar2;
  ostream *poVar3;
  ShaderType shaderType_00;
  DataType dataType;
  char *local_360;
  allocator<char> local_331;
  string local_330;
  string local_310;
  allocator<char> local_2e9;
  string local_2e8;
  string local_2c8;
  allocator<char> local_2a1;
  string local_2a0;
  string local_280;
  allocator<char> local_259;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  deUint32 local_1b8;
  ContextType local_1a4;
  ostringstream local_1a0 [8];
  ostringstream source;
  DataType dpdxDataType_local;
  DataType pDataType_local;
  DataType samplerDataType_local;
  ShaderType shaderType_local;
  NegativeTestContext *ctx_local;
  
  shaderType_00 = shaderType;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  pRVar2 = NegativeTestContext::getRenderContext((NegativeTestContext *)this);
  local_1a4.super_ApiType.m_bits = (ApiType)(*pRVar2->_vptr_RenderContext[2])();
  local_1b8 = (deUint32)glu::ApiType::es(3,2);
  bVar1 = glu::contextSupports(local_1a4,(ApiType)local_1b8);
  if (bVar1) {
    local_360 = glu::getGLSLVersionDeclaration(GLSL_VERSION_320_ES);
  }
  else {
    local_360 = glu::getGLSLVersionDeclaration(GLSL_VERSION_310_ES);
  }
  poVar3 = std::operator<<((ostream *)local_1a0,local_360);
  poVar3 = std::operator<<(poVar3,"\n");
  getDataTypeExtension_abi_cxx11_(&local_1f8,(_anonymous_namespace_ *)(ulong)shaderType,dataType);
  anon_unknown_0::getShaderExtensionDeclaration(&local_1d8,&local_1f8);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d8);
  getShaderInitialization_abi_cxx11_
            (&local_218,this,(NegativeTestContext *)((ulong)ctx & 0xffffffff),shaderType_00);
  poVar3 = std::operator<<(poVar3,(string *)&local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"sampler",&local_259);
  anon_unknown_0::declareShaderUniform(&local_238,shaderType,&local_258);
  poVar3 = std::operator<<(poVar3,(string *)&local_238);
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"\tmediump ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"P",&local_2a1);
  anon_unknown_0::declareAndInitializeShaderVariable(&local_280,samplerDataType,&local_2a0);
  poVar3 = std::operator<<(poVar3,(string *)&local_280);
  poVar3 = std::operator<<(poVar3,"\tmediump ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e8,"dPdx",&local_2e9);
  anon_unknown_0::declareAndInitializeShaderVariable(&local_2c8,pDataType,&local_2e8);
  poVar3 = std::operator<<(poVar3,(string *)&local_2c8);
  poVar3 = std::operator<<(poVar3,"\tmediump ");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"dPdy",&local_331);
  anon_unknown_0::declareAndInitializeShaderVariable(&local_310,dpdxDataType,&local_330);
  poVar3 = std::operator<<(poVar3,(string *)&local_310);
  poVar3 = std::operator<<(poVar3,"\ttextureGrad(sampler, P, dPdx, dPdy);\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::allocator<char>::~allocator(&local_2e9);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string genShaderSourceTextureGrad (NegativeTestContext& ctx, glu::ShaderType shaderType, glu::DataType samplerDataType, glu::DataType pDataType, glu::DataType dpdxDataType, glu::DataType dpdyDataType)
{
	std::ostringstream source;

	source	<< (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)) ? glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_320_ES) : glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_310_ES)) << "\n"
			<< getShaderExtensionDeclaration(getDataTypeExtension(samplerDataType))
			<< getShaderInitialization(ctx, shaderType)
			<< declareShaderUniform(samplerDataType, "sampler")
			<< "void main(void)\n"
			<< "{\n"
			<< "	mediump " << declareAndInitializeShaderVariable(pDataType, "P")
			<< "	mediump " << declareAndInitializeShaderVariable(dpdxDataType, "dPdx")
			<< "	mediump " << declareAndInitializeShaderVariable(dpdyDataType, "dPdy")
			<< "	textureGrad(sampler, P, dPdx, dPdy);\n"
			<< "}\n";

	return source.str();
}